

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::getRenderTextureBuffer
          (ManagedBuffer<unsigned_int> *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ManagedBuffer<unsigned_int> *in_RSI;
  shared_ptr<polyscope::render::TextureBuffer> sVar2;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  checkDeviceBufferTypeIsTexture(in_RSI);
  if ((in_RSI->renderTextureBuffer).
      super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ensureHostBufferPopulated(in_RSI);
    generateTextureBuffer<unsigned_int>
              ((DeviceBufferType)&local_50,(Engine *)(ulong)in_RSI->deviceBufferType);
    std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(in_RSI->renderTextureBuffer).
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>,
               &local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    switch(in_RSI->deviceBufferType) {
    case Attribute:
      std::__cxx11::string::string((string *)&local_40,"bad call",(allocator *)&local_50);
      exception(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      break;
    case Texture1d:
      peVar1 = (in_RSI->renderTextureBuffer).
               super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_TextureBuffer[2])(peVar1,(ulong)in_RSI->sizeX);
      break;
    case Texture2d:
      peVar1 = (in_RSI->renderTextureBuffer).
               super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_TextureBuffer[3])(peVar1,(ulong)in_RSI->sizeX,(ulong)in_RSI->sizeY);
      break;
    case Texture3d:
      peVar1 = (in_RSI->renderTextureBuffer).
               super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_TextureBuffer[4])
                (peVar1,(ulong)in_RSI->sizeX,(ulong)in_RSI->sizeY,(ulong)in_RSI->sizeZ);
    }
    peVar1 = (in_RSI->renderTextureBuffer).
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar1->_vptr_TextureBuffer[0xb])(peVar1,in_RSI->data);
  }
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(in_RSI->renderTextureBuffer).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>);
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<render::TextureBuffer> ManagedBuffer<T>::getRenderTextureBuffer() {
  checkDeviceBufferTypeIsTexture();

  if (!renderTextureBuffer) {
    ensureHostBufferPopulated(); // warning: the order of these matters because of how hostBufferPopulated works

    renderTextureBuffer = generateTextureBuffer<T>(deviceBufferType, render::engine);

    // templatize this?
    switch (deviceBufferType) {
    case DeviceBufferType::Attribute:
      exception("bad call");
      break;
    case DeviceBufferType::Texture1d:
      renderTextureBuffer->resize(sizeX);
      break;
    case DeviceBufferType::Texture2d:
      renderTextureBuffer->resize(sizeX, sizeY);
      break;
    case DeviceBufferType::Texture3d:
      renderTextureBuffer->resize(sizeX, sizeY, sizeZ);
      break;
    }

    renderTextureBuffer->setData(data);
  }
  return renderTextureBuffer;
}